

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_pcg.c
# Opt level: O0

SUNErrCode SUNLinSolFree_PCG(SUNLinearSolver S)

{
  long *in_RDI;
  
  if (in_RDI != (long *)0x0) {
    if (*in_RDI != 0) {
      if (*(long *)(*in_RDI + 0x50) != 0) {
        N_VDestroy(*(undefined8 *)(*in_RDI + 0x50));
        *(undefined8 *)(*in_RDI + 0x50) = 0;
      }
      if (*(long *)(*in_RDI + 0x58) != 0) {
        N_VDestroy(*(undefined8 *)(*in_RDI + 0x58));
        *(undefined8 *)(*in_RDI + 0x58) = 0;
      }
      if (*(long *)(*in_RDI + 0x60) != 0) {
        N_VDestroy(*(undefined8 *)(*in_RDI + 0x60));
        *(undefined8 *)(*in_RDI + 0x60) = 0;
      }
      if (*(long *)(*in_RDI + 0x68) != 0) {
        N_VDestroy(*(undefined8 *)(*in_RDI + 0x68));
        *(undefined8 *)(*in_RDI + 0x68) = 0;
      }
      free((void *)*in_RDI);
      *in_RDI = 0;
    }
    if (in_RDI[1] != 0) {
      free((void *)in_RDI[1]);
      in_RDI[1] = 0;
    }
    free(in_RDI);
  }
  return 0;
}

Assistant:

SUNErrCode SUNLinSolFree_PCG(SUNLinearSolver S)
{
  if (S == NULL) { return SUN_SUCCESS; }

  if (S->content)
  {
    /* delete items from within the content structure */
    if (PCG_CONTENT(S)->r)
    {
      N_VDestroy(PCG_CONTENT(S)->r);
      PCG_CONTENT(S)->r = NULL;
    }
    if (PCG_CONTENT(S)->p)
    {
      N_VDestroy(PCG_CONTENT(S)->p);
      PCG_CONTENT(S)->p = NULL;
    }
    if (PCG_CONTENT(S)->z)
    {
      N_VDestroy(PCG_CONTENT(S)->z);
      PCG_CONTENT(S)->z = NULL;
    }
    if (PCG_CONTENT(S)->Ap)
    {
      N_VDestroy(PCG_CONTENT(S)->Ap);
      PCG_CONTENT(S)->Ap = NULL;
    }
    free(S->content);
    S->content = NULL;
  }
  if (S->ops)
  {
    free(S->ops);
    S->ops = NULL;
  }
  free(S);
  S = NULL;
  return SUN_SUCCESS;
}